

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::BIP32PubkeyProvider::ToString_abi_cxx11_
          (BIP32PubkeyProvider *this,StringType type,bool normalized)

{
  long lVar1;
  bool bVar2;
  undefined1 in_CL;
  undefined4 in_EDX;
  CExtPubKey *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  bool use_apostrophe;
  string *ret;
  BIP32PubkeyProvider *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  char __c;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 uVar4;
  uint uVar5;
  undefined1 apostrophe;
  CExtPubKey *path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  apostrophe = (undefined1)((uint)in_EDX >> 0x18);
  uVar5 = CONCAT31((int3)in_EDX,in_CL) & 0xffffff01;
  if (((char)uVar5 != '\0') ||
     (__c = true, (in_RSI[1].chaincode.super_base_blob<256U>.m_data._M_elems[0x18] & 1) == 0)) {
    __c = CONCAT13(apostrophe,(int3)(uVar5 >> 8)) == 1;
  }
  uVar3 = 0;
  this_00 = in_RDI;
  uVar4 = __c;
  path = in_RSI;
  EncodeExtPubKey_abi_cxx11_(in_RSI);
  FormatHDKeypath_abi_cxx11_
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)path,(bool)apostrophe);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(apostrophe,
                          CONCAT43(uVar5,CONCAT12(uVar4,CONCAT11(uVar3,in_stack_ffffffffffffffa0))))
                 ,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68);
  bVar2 = anon_unknown.dwarf_33386e4::BIP32PubkeyProvider::IsRange(in_stack_ffffffffffffff68);
  if ((bVar2) &&
     (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this_00,(char *)CONCAT17(__c,in_stack_ffffffffffffff70)),
     *(int *)(in_RSI[1].chaincode.super_base_blob<256U>.m_data._M_elems + 0x14) == 2)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_00,__c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string ToString(StringType type, bool normalized) const
    {
        // If StringType==COMPAT, always use the apostrophe to stay compatible with previous versions
        const bool use_apostrophe = (!normalized && m_apostrophe) || type == StringType::COMPAT;
        std::string ret = EncodeExtPubKey(m_root_extkey) + FormatHDKeypath(m_path, /*apostrophe=*/use_apostrophe);
        if (IsRange()) {
            ret += "/*";
            if (m_derive == DeriveType::HARDENED) ret += use_apostrophe ? '\'' : 'h';
        }
        return ret;
    }